

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O1

void __thiscall depspawn::internal::arg_info::solve_overlap(arg_info *this,arg_info *other)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  arg_info *paVar4;
  bool bVar5;
  arg_info *local_8;
  
  bVar5 = true;
  if (this->wr == false) {
    bVar5 = other->wr;
  }
  uVar2 = this->size;
  uVar3 = other->size;
  if (uVar2 - uVar3 == 0) {
    other->wr = bVar5;
    paVar4 = (arg_info *)Pool._32_8_;
    do {
      this->next = paVar4;
      LOCK();
      bVar5 = paVar4 != (arg_info *)Pool._32_8_;
      uVar2 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
      if (bVar5) {
        paVar4 = (arg_info *)Pool._32_8_;
        uVar2 = Pool._32_8_;
      }
      Pool._32_8_ = uVar2;
      UNLOCK();
    } while (bVar5);
  }
  else {
    if (uVar2 < uVar3) {
      bVar1 = other->wr;
      paVar4 = (arg_info *)Pool._32_8_;
      if (bVar5 == bVar1) {
        do {
          this->next = paVar4;
          LOCK();
          bVar5 = paVar4 != (arg_info *)Pool._32_8_;
          uVar2 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
          if (bVar5) {
            paVar4 = (arg_info *)Pool._32_8_;
            uVar2 = Pool._32_8_;
          }
          Pool._32_8_ = uVar2;
          UNLOCK();
        } while (bVar5);
        return;
      }
      this->addr = this->addr + uVar2;
      this->size = uVar3 - uVar2;
      this->wr = bVar1;
      other->size = uVar2;
      other->wr = bVar5;
    }
    else {
      if (this->wr == bVar5) {
        other->wr = bVar5;
        other->size = uVar2;
        paVar4 = (arg_info *)Pool._32_8_;
        do {
          this->next = paVar4;
          LOCK();
          bVar5 = paVar4 != (arg_info *)Pool._32_8_;
          uVar2 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
          if (bVar5) {
            paVar4 = (arg_info *)Pool._32_8_;
            uVar2 = Pool._32_8_;
          }
          Pool._32_8_ = uVar2;
          UNLOCK();
        } while (bVar5);
        return;
      }
      this->addr = this->addr + uVar3;
      this->size = uVar2 - uVar3;
    }
    local_8 = other;
    insert_in_arglist(this,&local_8);
  }
  return;
}

Assistant:

void arg_info::solve_overlap(arg_info *other)
    { size_t tmp_size;
      
      //fprintf(stderr, "%zu [%d %zu] [d %zu]\n", addr, other->wr, other->size, wr, size);
      
      const bool orwr = wr || other->wr;
      
      if(size == other->size) {
	other->wr = orwr;
	Pool.free(this);
      } else if (size < other->size) {
	
	if(orwr == other->wr)
	  Pool.free(this);
	else {
	  tmp_size = size;
	  
	  addr += size;
	  size = other->size - size;
	  wr = other->wr; //should be false
	  
	  other->size = tmp_size;
	  other->wr = orwr; //should be true
	  
	  insert_in_arglist(other);
	}
	
      } else { //size > other->size
	
	if(orwr == wr) {
	  other->wr = orwr;
	  other->size = size;
	  Pool.free(this);
	} else { //Should be other->wr = true, this->wr = false
	  tmp_size = other->size;
	  
	  addr += tmp_size;
	  size -= tmp_size;
	  
	  insert_in_arglist(other);
	}
	
      }
      
    }